

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::Event::~Event(Event *this)

{
  Event **ppEVar1;
  Event **ppEVar2;
  EventLoop *pEVar3;
  Event *pEVar4;
  long in_FS_OFFSET;
  Fault f;
  Fault local_10;
  
  this->_vptr_Event = (_func_int **)&PTR_getInnerForTrace_004488d8;
  ppEVar2 = this->prev;
  if (ppEVar2 != (Event **)0x0) {
    pEVar3 = this->loop;
    ppEVar1 = &this->next;
    if (pEVar3->tail == ppEVar1) {
      pEVar3->tail = ppEVar2;
    }
    if (pEVar3->depthFirstInsertPoint == ppEVar1) {
      pEVar3->depthFirstInsertPoint = ppEVar2;
    }
    pEVar4 = *ppEVar1;
    *ppEVar2 = pEVar4;
    if (pEVar4 != (Event *)0x0) {
      pEVar4->prev = this->prev;
    }
  }
  if (this->firing != true) {
    if ((*(EventLoop **)(in_FS_OFFSET + -0x10) != (EventLoop *)0x0) &&
       (*(EventLoop **)(in_FS_OFFSET + -0x10) != this->loop)) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                (&local_10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
                 ,0x213,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
                 "\"Promise destroyed from a different thread than it was created in.\"",
                 (char (*) [66])"Promise destroyed from a different thread than it was created in.")
      ;
      Debug::Fault::fatal(&local_10);
    }
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x211,FAILED,"!firing","\"Promise callback destroyed itself.\"",
             (char (*) [35])"Promise callback destroyed itself.");
  Debug::Fault::fatal(&local_10);
}

Assistant:

Event::~Event() noexcept(false) {
  if (prev != nullptr) {
    if (loop.tail == &next) {
      loop.tail = prev;
    }
    if (loop.depthFirstInsertPoint == &next) {
      loop.depthFirstInsertPoint = prev;
    }

    *prev = next;
    if (next != nullptr) {
      next->prev = prev;
    }
  }

  KJ_REQUIRE(!firing, "Promise callback destroyed itself.");
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Promise destroyed from a different thread than it was created in.");
}